

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void rsqrtps_(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  undefined8 uVar2;
  
  if ((pMyDisasm->Reserved_).EVEX.state != '\x01') {
    if ((pMyDisasm->Reserved_).VEX.state != '\x01') {
      if ((pMyDisasm->Reserved_).PrefRepe == 1) {
        (pMyDisasm->Prefix).RepPrefix = '\b';
        (pMyDisasm->Reserved_).MemDecoration = 0x67;
        (pMyDisasm->Instruction).Category = 0x40002;
        uVar2 = 0x73737472717372;
      }
      else {
        if (((pMyDisasm->Prefix).OperandSize == '\x01') || ((pMyDisasm->Reserved_).PrefRepne == 1))
        goto LAB_0011db07;
        (pMyDisasm->Reserved_).MemDecoration = 0x6d;
        (pMyDisasm->Instruction).Category = 0x40002;
        uVar2 = 0x73707472717372;
      }
      *(undefined8 *)(pMyDisasm->Instruction).Mnemonic = uVar2;
      (pMyDisasm->Reserved_).Register_ = 4;
      decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
      (pMyDisasm->Reserved_).EIP_ =
           (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
      return;
    }
    UVar1 = (pMyDisasm->Reserved_).VEX.pp;
    if (UVar1 == '\x02') {
      (pMyDisasm->Instruction).Category = 0x110000;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vrsqrtss",9);
      (pMyDisasm->Reserved_).MemDecoration = 0xcb;
      (pMyDisasm->Reserved_).Register_ = 4;
      GyEy(pMyDisasm);
      return;
    }
    if (UVar1 == '\0') {
      (pMyDisasm->Instruction).Category = 0x110000;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vrsqrtps",9);
      vex_GxEx(pMyDisasm);
      return;
    }
  }
LAB_0011db07:
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
  (pMyDisasm->Operand1).AccessMode = 0;
  (pMyDisasm->Operand2).AccessMode = 0;
  (pMyDisasm->Operand3).AccessMode = 0;
  (pMyDisasm->Operand4).AccessMode = 0;
  (pMyDisasm->Operand5).AccessMode = 0;
  (pMyDisasm->Operand6).AccessMode = 0;
  (pMyDisasm->Operand7).AccessMode = 0;
  (pMyDisasm->Operand8).AccessMode = 0;
  (pMyDisasm->Operand9).AccessMode = 0;
  (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
  return;
}

Assistant:

void __bea_callspec__ rsqrtps_(PDISASM pMyDisasm)
{
 if (GV.EVEX.state == InUsePrefix) {
   failDecode(pMyDisasm);
 }
 else if (GV.VEX.state == InUsePrefix) {

   if (GV.VEX.pp == 0) {
     pMyDisasm->Instruction.Category = AVX_INSTRUCTION;
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vrsqrtps");
     #endif
     vex_GxEx(pMyDisasm);
   }
   else if (GV.VEX.pp == 2) {
     pMyDisasm->Instruction.Category = AVX_INSTRUCTION;
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vrsqrtss");
     #endif
     GV.MemDecoration = Arg3dword;
     GV.Register_ = SSE_REG;
     GyEy(pMyDisasm);

   }
   else {
     failDecode(pMyDisasm);
   }
 }
 else {
   /* ========== 0xf3 */
   if (GV.PrefRepe == 1) {
     pMyDisasm->Prefix.RepPrefix = MandatoryPrefix;
     GV.MemDecoration = Arg2dword;
     pMyDisasm->Instruction.Category = SSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "rsqrtss");
     #endif
     GV.Register_ = SSE_REG;
     GxEx(pMyDisasm);

   }
   else {
     if (prefixes_present(pMyDisasm)) { failDecode(pMyDisasm); return; }
     GV.MemDecoration = Arg2_m128_xmm;
     pMyDisasm->Instruction.Category = SSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "rsqrtps");
     #endif
     GV.Register_ = SSE_REG;
     GxEx(pMyDisasm);

   }
 }

}